

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

char * luaL_prepbuffsize(luaL_Buffer *B,size_t sz)

{
  ulong uVar1;
  lua_State *L;
  ulong uVar2;
  int iVar3;
  char *__dest;
  undefined8 *puVar4;
  ulong newsize;
  
  uVar1 = B->n;
  if (B->size - uVar1 < sz) {
    uVar2 = B->size * 2;
    newsize = uVar1 + sz;
    if (sz <= uVar2 - uVar1) {
      newsize = uVar2;
    }
    L = B->L;
    if (!(bool)(~(newsize < uVar1) & sz <= newsize - uVar1)) {
      luaL_error(L,"buffer too large");
    }
    if (B->b == B->initb) {
      puVar4 = (undefined8 *)lua_newuserdata(L,0x10);
      *puVar4 = 0;
      puVar4[1] = 0;
      iVar3 = luaL_newmetatable(L,"LUABOX");
      if (iVar3 != 0) {
        lua_pushcclosure(L,boxgc,0);
        lua_setfield(L,-2,"__gc");
      }
      lua_setmetatable(L,-2);
      __dest = (char *)resizebox(L,-1,newsize);
      memcpy(__dest,B->b,B->n);
    }
    else {
      __dest = (char *)resizebox(L,-1,newsize);
    }
    B->b = __dest;
    B->size = newsize;
  }
  return B->b + B->n;
}

Assistant:

LUALIB_API char *luaL_prepbuffsize (luaL_Buffer *B, size_t sz) {
  lua_State *L = B->L;
  if (B->size - B->n < sz) {  /* not enough space? */
    char *newbuff;
    size_t newsize = B->size * 2;  /* double buffer size */
    if (newsize - B->n < sz)  /* not big enough? */
      newsize = B->n + sz;
    if (newsize < B->n || newsize - B->n < sz)
      luaL_error(L, "buffer too large");
    /* create larger buffer */
    if (buffonstack(B))
      newbuff = (char *)resizebox(L, -1, newsize);
    else {  /* no buffer yet */
      newbuff = (char *)newbox(L, newsize);
      memcpy(newbuff, B->b, B->n * sizeof(char));  /* copy original content */
    }
    B->b = newbuff;
    B->size = newsize;
  }
  return &B->b[B->n];
}